

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1ToCFFEmbeddedFontWriter.cpp
# Opt level: O1

EStatusCode __thiscall
Type1ToCFFEmbeddedFontWriter::WriteCFFHeader(Type1ToCFFEmbeddedFontWriter *this)

{
  EStatusCode EVar1;
  CFFPrimitiveWriter *this_00;
  
  this_00 = &this->mPrimitivesWriter;
  CFFPrimitiveWriter::WriteCard8(this_00,'\x01');
  CFFPrimitiveWriter::WriteCard8(this_00,'\0');
  CFFPrimitiveWriter::WriteCard8(this_00,'\x04');
  CFFPrimitiveWriter::WriteOffSize(this_00,'\x02');
  EVar1 = CFFPrimitiveWriter::GetInternalState(this_00);
  return EVar1;
}

Assistant:

EStatusCode Type1ToCFFEmbeddedFontWriter::WriteCFFHeader()
{
	// write a default CFF header. i'm using dummies for the offset sizes, cause i don't think they really
	// matter anyways.
	mPrimitivesWriter.WriteCard8(1);
	mPrimitivesWriter.WriteCard8(0);
	mPrimitivesWriter.WriteCard8(4);
	mPrimitivesWriter.WriteOffSize(2);

	return mPrimitivesWriter.GetInternalState();
}